

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O2

void __thiscall
cmDebugger_impl::PreRunHook
          (cmDebugger_impl *this,cmListFileContext *context,cmListFileFunction *line)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  long lVar5;
  size_t bid;
  ulong uVar6;
  cmListFileBacktrace local_50;
  
  SetState(this,Running);
  cmListFileContext::operator=(&this->currentLocation,context);
  if (this->breakDepth != -1) {
    (**(this->super_cmDebugger)._vptr_cmDebugger)(&local_50,this);
    sVar3 = cmListFileBacktrace::Depth(&local_50);
    cmListFileBacktrace::~cmListFileBacktrace(&local_50);
    if (sVar3 == (long)this->breakDepth) {
      LOCK();
      (this->breakPending)._M_base._M_i = true;
      UNLOCK();
    }
  }
  std::mutex::lock(&this->breakpointMutex);
  lVar5 = 0;
  uVar6 = 0;
  while( true ) {
    pcVar1 = (this->breakpoints).super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->breakpoints).
                       super__Vector_base<cmBreakpoint,_std::allocator<cmBreakpoint>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pcVar1) / 0x30) <= uVar6)
    goto LAB_0034733a;
    bVar2 = cmBreakpoint::matches((cmBreakpoint *)((long)&pcVar1->Id + lVar5),context);
    if (bVar2) break;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x30;
  }
  LOCK();
  (this->breakPending)._M_base._M_i = true;
  UNLOCK();
  for (p_Var4 = (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->listeners)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    (**(code **)(**(long **)(p_Var4 + 1) + 0x18))(*(long **)(p_Var4 + 1),uVar6);
  }
LAB_0034733a:
  pthread_mutex_unlock((pthread_mutex_t *)&this->breakpointMutex);
  if (((this->breakPending)._M_base._M_i & 1U) != 0) {
    PauseExecution(this);
  }
  return;
}

Assistant:

void PreRunHook(const cmListFileContext& context,
                  const cmListFileFunction& line) override
  {
    (void)line;

    SetState(State::Running);
    currentLocation = context;

    // Step in / Step out logic. We have a target
    // stack depth, and when we hit it, pause.
    if (breakDepth != -1) {
      auto currentDepth = GetBacktrace().Depth();
      if (currentDepth == (size_t)breakDepth) {
        breakPending = true;
      }
    }

    // Breakpoint detection
    {
      std::lock_guard<std::mutex> lock(breakpointMutex);
      for (size_t bid = 0; bid < breakpoints.size(); bid++) {
        auto& bp = breakpoints[bid];
        if (bp.matches(context)) {
          breakPending = true;
          for (auto& l : listeners) {
            l->OnBreakpoint(bid);
          }
          break;
        }
      }
    }

    // If a break is pending, act on it.
    // Note that we
    if (breakPending) {
      PauseExecution();
    }
  }